

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitStringTest_x_iutest_x_FormatSizeTByte_Test::Body
          (iu_UnitStringTest_x_iutest_x_FormatSizeTByte_Test *this)

{
  bool bVar1;
  char *pcVar2;
  UInt64 value;
  UInt64 value_00;
  type **in_stack_fffffffffffffb98;
  AssertionHelper local_420;
  Fixed local_3f0;
  string local_268;
  undefined1 local_248 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1f0;
  string local_58;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_UnitStringTest_x_iutest_x_FormatSizeTByte_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::detail::FormatSizeByte_abi_cxx11_(&local_58,(detail *)0x10000000000,value);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_38,(internal *)"\"1TB\"",
             "::iutest::detail::FormatSizeByte(1024ull * 1024 * 1024 * 1024)","1TB",
             (char *)&local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffb98);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1f0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x113,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1f0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  iutest::detail::FormatSizeByte_abi_cxx11_(&local_268,(detail *)0x4000000000000,value_00);
  iutest::internal::CmpHelperSTREQ<char_const*,std::__cxx11::string>
            ((AssertionResult *)local_248,(internal *)"\"1024TB\"",
             "::iutest::detail::FormatSizeByte(1024ull * 1024 * 1024 * 1024 * 1024)","1024TB",
             (char *)&local_268,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffb98);
  std::__cxx11::string::~string((string *)&local_268);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    memset(&local_3f0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3f0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_248);
    iutest::AssertionHelper::AssertionHelper
              (&local_420,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x114,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_420,&local_3f0);
    iutest::AssertionHelper::~AssertionHelper(&local_420);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3f0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  return;
}

Assistant:

IUTEST(UnitStringTest, FormatSizeTByte)
{
    IUTEST_EXPECT_STREQ("1TB", ::iutest::detail::FormatSizeByte(1024ull * 1024 * 1024 * 1024));
    IUTEST_EXPECT_STREQ("1024TB", ::iutest::detail::FormatSizeByte(1024ull * 1024 * 1024 * 1024 * 1024));
}